

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfile.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  SDL_RWops *pSVar2;
  long lVar3;
  undefined8 uVar4;
  uint uVar5;
  char *ctx;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  char test_buf [30];
  char local_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char cStack_30;
  char cStack_2f;
  char cStack_2e;
  char cStack_2d;
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char cStack_29;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  undefined8 local_18;
  undefined8 uStack_10;
  
  unlink("sdldata1");
  unlink("sdldata2");
  pSVar2 = (SDL_RWops *)SDL_RWFromFile(0,0);
  if (pSVar2 == (SDL_RWops *)0x0) {
    pSVar2 = (SDL_RWops *)SDL_RWFromFile(0,"ab+");
    if (pSVar2 != (SDL_RWops *)0x0) {
      uVar5 = 0x39;
      goto LAB_00101a91;
    }
    pSVar2 = (SDL_RWops *)SDL_RWFromFile(0,"sldfkjsldkfj");
    if (pSVar2 != (SDL_RWops *)0x0) {
      uVar5 = 0x3b;
      goto LAB_00101a91;
    }
    pSVar2 = (SDL_RWops *)SDL_RWFromFile("something","");
    if (pSVar2 != (SDL_RWops *)0x0) {
      uVar5 = 0x3d;
      goto LAB_00101a91;
    }
    pSVar2 = (SDL_RWops *)SDL_RWFromFile("something",0);
    if (pSVar2 != (SDL_RWops *)0x0) {
      uVar5 = 0x3f;
      goto LAB_00101a91;
    }
    puts("test1 OK");
    pSVar2 = (SDL_RWops *)SDL_RWFromFile("sdldata2","rb");
    if (pSVar2 != (SDL_RWops *)0x0) {
      uVar5 = 0x48;
      goto LAB_00101a91;
    }
    pSVar2 = (SDL_RWops *)SDL_RWFromFile("sdldata2","rb+");
    if (pSVar2 != (SDL_RWops *)0x0) {
      uVar5 = 0x4a;
      goto LAB_00101a91;
    }
    lVar3 = SDL_RWFromFile("sdldata2","wb");
    if (lVar3 != 0) {
      (**(code **)(lVar3 + 0x18))(lVar3);
      unlink("sdldata2");
      lVar3 = SDL_RWFromFile("sdldata2","wb+");
      if (lVar3 == 0) {
        uVar4 = 0x4f;
      }
      else {
        (**(code **)(lVar3 + 0x18))(lVar3);
        unlink("sdldata2");
        lVar3 = SDL_RWFromFile("sdldata2","ab");
        if (lVar3 == 0) {
          uVar4 = 0x52;
        }
        else {
          (**(code **)(lVar3 + 0x18))(lVar3);
          unlink("sdldata2");
          lVar3 = SDL_RWFromFile("sdldata2","ab+");
          if (lVar3 == 0) {
            uVar4 = 0x55;
          }
          else {
            (**(code **)(lVar3 + 0x18))(lVar3);
            unlink("sdldata2");
            puts("test2 OK");
            pSVar2 = (SDL_RWops *)SDL_RWFromFile("sdldata1","wb");
            if (pSVar2 != (SDL_RWops *)0x0) {
              iVar1 = (*pSVar2->write)(pSVar2,"1234567890",10,1);
              if (iVar1 == 1) {
                iVar1 = (*pSVar2->write)(pSVar2,"1234567890",1,10);
                if (iVar1 == 10) {
                  iVar1 = (*pSVar2->write)(pSVar2,"1234567",1,7);
                  if (iVar1 == 7) {
                    iVar1 = (*pSVar2->seek)(pSVar2,0,0);
                    if (iVar1 == 0) {
                      iVar1 = (*pSVar2->read)(pSVar2,&local_38,1,1);
                      if (iVar1 == 0) {
                        (*pSVar2->close)(pSVar2);
                        pSVar2 = (SDL_RWops *)SDL_RWFromFile("sdldata1","rb");
                        if (pSVar2 == (SDL_RWops *)0x0) {
                          uVar4 = 0x66;
                          goto LAB_00101cdb;
                        }
                        iVar1 = (*pSVar2->seek)(pSVar2,0,0);
                        if (iVar1 == 0) {
                          iVar1 = (*pSVar2->seek)(pSVar2,-7,2);
                          if (iVar1 == 0x14) {
                            iVar1 = (*pSVar2->read)(pSVar2,&local_38,1,7);
                            if (iVar1 == 7) {
                              if (CONCAT13(cStack_32,
                                           CONCAT12(cStack_33,CONCAT11(cStack_34,cStack_35))) ==
                                  0x37363534 &&
                                  CONCAT13(cStack_35,
                                           CONCAT12(cStack_36,CONCAT11(cStack_37,local_38))) ==
                                  0x34333231) {
                                iVar1 = (*pSVar2->read)(pSVar2,&local_38,1,1);
                                if (iVar1 == 0) {
                                  iVar1 = (*pSVar2->read)(pSVar2,&local_38,10,100);
                                  if (iVar1 == 0) {
                                    iVar1 = (*pSVar2->seek)(pSVar2,-0x1b,1);
                                    if (iVar1 == 0) {
                                      iVar1 = (*pSVar2->read)(pSVar2,&local_38,10,3);
                                      if (iVar1 == 2) {
                                        auVar10[0] = -((char)_local_28 == '7');
                                        auVar10[1] = -((char)((uint)_local_28 >> 8) == '8');
                                        auVar10[2] = -((char)((uint)_local_28 >> 0x10) == '9');
                                        auVar10[3] = -((char)((uint)_local_28 >> 0x18) == '0');
                                        auVar10[4] = 0xff;
                                        auVar10[5] = 0xff;
                                        auVar10[6] = 0xff;
                                        auVar10[7] = 0xff;
                                        auVar10[8] = 0xff;
                                        auVar10[9] = 0xff;
                                        auVar10[10] = 0xff;
                                        auVar10[0xb] = 0xff;
                                        auVar10[0xc] = 0xff;
                                        auVar10[0xd] = 0xff;
                                        auVar10[0xe] = 0xff;
                                        auVar10[0xf] = 0xff;
                                        auVar6[0] = -(local_38 == '1');
                                        auVar6[1] = -(cStack_37 == '2');
                                        auVar6[2] = -(cStack_36 == '3');
                                        auVar6[3] = -(cStack_35 == '4');
                                        auVar6[4] = -(cStack_34 == '5');
                                        auVar6[5] = -(cStack_33 == '6');
                                        auVar6[6] = -(cStack_32 == '7');
                                        auVar6[7] = -(cStack_31 == '8');
                                        auVar6[8] = -(cStack_30 == '9');
                                        auVar6[9] = -(cStack_2f == '0');
                                        auVar6[10] = -(cStack_2e == '1');
                                        auVar6[0xb] = -(cStack_2d == '2');
                                        auVar6[0xc] = -(cStack_2c == '3');
                                        auVar6[0xd] = -(cStack_2b == '4');
                                        auVar6[0xe] = -(cStack_2a == '5');
                                        auVar6[0xf] = -(cStack_29 == '6');
                                        auVar6 = auVar6 & auVar10;
                                        if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                                                     (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                                                     (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                                                     (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                                                     (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                                                     (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                                                     (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                                                     (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                                                     (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                                                     (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                                                     (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                                                     (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                                                     (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                                                     (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                                                     (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                                                    (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) ==
                                            0xffff) {
                                          iVar1 = (*pSVar2->write)(pSVar2,&local_38,1,1);
                                          if (iVar1 == 0) {
                                            (*pSVar2->close)(pSVar2);
                                            pSVar2 = (SDL_RWops *)SDL_RWFromFile("sdldata1","wb+");
                                            if (pSVar2 == (SDL_RWops *)0x0) {
                                              uVar4 = 0x75;
                                              goto LAB_00101cdb;
                                            }
                                            iVar1 = (*pSVar2->write)(pSVar2,"1234567890",10,1);
                                            if (iVar1 == 1) {
                                              iVar1 = (*pSVar2->write)(pSVar2,"1234567890",1,10);
                                              if (iVar1 == 10) {
                                                iVar1 = (*pSVar2->write)(pSVar2,"1234567",1,7);
                                                if (iVar1 == 7) {
                                                  iVar1 = (*pSVar2->seek)(pSVar2,0,0);
                                                  if (iVar1 == 0) {
                                                    iVar1 = (*pSVar2->read)(pSVar2,&local_38,1,1);
                                                    if (iVar1 == 1) {
                                                      iVar1 = (*pSVar2->seek)(pSVar2,0,0);
                                                      if (iVar1 == 0) {
                                                        iVar1 = (*pSVar2->seek)(pSVar2,-7,2);
                                                        if (iVar1 == 0x14) {
                                                          iVar1 = (*pSVar2->read)(pSVar2,&local_38,1
                                                                                  ,7);
                                                          if (iVar1 == 7) {
                                                            if (CONCAT13(cStack_32,
                                                                         CONCAT12(cStack_33,
                                                                                  CONCAT11(cStack_34
                                                  ,cStack_35))) == 0x37363534 &&
                                                  CONCAT13(cStack_35,
                                                           CONCAT12(cStack_36,
                                                                    CONCAT11(cStack_37,local_38)))
                                                  == 0x34333231) {
                                                    iVar1 = (*pSVar2->read)(pSVar2,&local_38,1,1);
                                                    if (iVar1 == 0) {
                                                      iVar1 = (*pSVar2->read)(pSVar2,&local_38,10,
                                                                              100);
                                                      if (iVar1 == 0) {
                                                        iVar1 = (*pSVar2->seek)(pSVar2,-0x1b,1);
                                                        if (iVar1 == 0) {
                                                          iVar1 = (*pSVar2->read)(pSVar2,&local_38,
                                                                                  10,3);
                                                          if (iVar1 == 2) {
                                                            auVar7[0] = -((char)_local_28 == '7');
                                                            auVar7[1] = -((char)((uint)_local_28 >>
                                                                                8) == '8');
                                                            auVar7[2] = -((char)((uint)_local_28 >>
                                                                                0x10) == '9');
                                                            auVar7[3] = -((char)((uint)_local_28 >>
                                                                                0x18) == '0');
                                                            auVar7[4] = 0xff;
                                                            auVar7[5] = 0xff;
                                                            auVar7[6] = 0xff;
                                                            auVar7[7] = 0xff;
                                                            auVar7[8] = 0xff;
                                                            auVar7[9] = 0xff;
                                                            auVar7[10] = 0xff;
                                                            auVar7[0xb] = 0xff;
                                                            auVar7[0xc] = 0xff;
                                                            auVar7[0xd] = 0xff;
                                                            auVar7[0xe] = 0xff;
                                                            auVar7[0xf] = 0xff;
                                                            local_18 = 0x3837363534333231;
                                                            uStack_10 = 0x3635343332313039;
                                                            auVar11[0] = -(local_38 == '1');
                                                            auVar11[1] = -(cStack_37 == '2');
                                                            auVar11[2] = -(cStack_36 == '3');
                                                            auVar11[3] = -(cStack_35 == '4');
                                                            auVar11[4] = -(cStack_34 == '5');
                                                            auVar11[5] = -(cStack_33 == '6');
                                                            auVar11[6] = -(cStack_32 == '7');
                                                            auVar11[7] = -(cStack_31 == '8');
                                                            auVar11[8] = -(cStack_30 == '9');
                                                            auVar11[9] = -(cStack_2f == '0');
                                                            auVar11[10] = -(cStack_2e == '1');
                                                            auVar11[0xb] = -(cStack_2d == '2');
                                                            auVar11[0xc] = -(cStack_2c == '3');
                                                            auVar11[0xd] = -(cStack_2b == '4');
                                                            auVar11[0xe] = -(cStack_2a == '5');
                                                            auVar11[0xf] = -(cStack_29 == '6');
                                                            auVar7 = auVar7 & auVar11;
                                                            if ((ushort)((ushort)(SUB161(auVar7 >> 7
                                                                                         ,0) & 1) |
                                                                         (ushort)(SUB161(auVar7 >> 
                                                  0xf,0) & 1) << 1 |
                                                  (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                                                  (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                                                  (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff
                                                  ) {
                                                    (*pSVar2->close)(pSVar2);
                                                    puts("test3 OK");
                                                    pSVar2 = (SDL_RWops *)
                                                             SDL_RWFromFile("sdldata1","rb+");
                                                    if (pSVar2 == (SDL_RWops *)0x0) {
                                                      uVar4 = 0x89;
                                                      goto LAB_00101cdb;
                                                    }
                                                    iVar1 = (*pSVar2->write)(pSVar2,"1234567890",10,
                                                                             1);
                                                    if (iVar1 == 1) {
                                                      iVar1 = (*pSVar2->write)(pSVar2,"1234567890",1
                                                                               ,10);
                                                      if (iVar1 == 10) {
                                                        iVar1 = (*pSVar2->write)(pSVar2,"1234567",1,
                                                                                 7);
                                                        if (iVar1 == 7) {
                                                          iVar1 = (*pSVar2->seek)(pSVar2,0,0);
                                                          if (iVar1 == 0) {
                                                            iVar1 = (*pSVar2->read)(pSVar2,&local_38
                                                                                    ,1,1);
                                                            if (iVar1 == 1) {
                                                              iVar1 = (*pSVar2->seek)(pSVar2,0,0);
                                                              if (iVar1 == 0) {
                                                                iVar1 = (*pSVar2->seek)(pSVar2,-7,2)
                                                                ;
                                                                if (iVar1 == 0x14) {
                                                                  iVar1 = (*pSVar2->read)(pSVar2,&
                                                  local_38,1,7);
                                                  if (iVar1 == 7) {
                                                    if (CONCAT13(cStack_32,
                                                                 CONCAT12(cStack_33,
                                                                          CONCAT11(cStack_34,
                                                                                   cStack_35))) ==
                                                        0x37363534 &&
                                                        CONCAT13(cStack_35,
                                                                 CONCAT12(cStack_36,
                                                                          CONCAT11(cStack_37,
                                                                                   local_38))) ==
                                                        0x34333231) {
                                                      iVar1 = (*pSVar2->read)(pSVar2,&local_38,1,1);
                                                      if (iVar1 == 0) {
                                                        iVar1 = (*pSVar2->read)(pSVar2,&local_38,10,
                                                                                100);
                                                        if (iVar1 == 0) {
                                                          iVar1 = (*pSVar2->seek)(pSVar2,-0x1b,1);
                                                          if (iVar1 == 0) {
                                                            iVar1 = (*pSVar2->read)(pSVar2,&local_38
                                                                                    ,10,3);
                                                            if (iVar1 == 2) {
                                                              auVar8[0] = -((char)_local_28 == '7');
                                                              auVar8[1] = -((char)((uint)_local_28
                                                                                  >> 8) == '8');
                                                              auVar8[2] = -((char)((uint)_local_28
                                                                                  >> 0x10) == '9');
                                                              auVar8[3] = -((char)((uint)_local_28
                                                                                  >> 0x18) == '0');
                                                              auVar8[4] = 0xff;
                                                              auVar8[5] = 0xff;
                                                              auVar8[6] = 0xff;
                                                              auVar8[7] = 0xff;
                                                              auVar8[8] = 0xff;
                                                              auVar8[9] = 0xff;
                                                              auVar8[10] = 0xff;
                                                              auVar8[0xb] = 0xff;
                                                              auVar8[0xc] = 0xff;
                                                              auVar8[0xd] = 0xff;
                                                              auVar8[0xe] = 0xff;
                                                              auVar8[0xf] = 0xff;
                                                              auVar12[0] = -(local_38 ==
                                                                            (char)local_18);
                                                              auVar12[1] = -(cStack_37 ==
                                                                            local_18._1_1_);
                                                              auVar12[2] = -(cStack_36 ==
                                                                            local_18._2_1_);
                                                              auVar12[3] = -(cStack_35 ==
                                                                            local_18._3_1_);
                                                              auVar12[4] = -(cStack_34 ==
                                                                            local_18._4_1_);
                                                              auVar12[5] = -(cStack_33 ==
                                                                            local_18._5_1_);
                                                              auVar12[6] = -(cStack_32 ==
                                                                            local_18._6_1_);
                                                              auVar12[7] = -(cStack_31 ==
                                                                            local_18._7_1_);
                                                              auVar12[8] = -(cStack_30 ==
                                                                            (char)uStack_10);
                                                              auVar12[9] = -(cStack_2f ==
                                                                            uStack_10._1_1_);
                                                              auVar12[10] = -(cStack_2e ==
                                                                             uStack_10._2_1_);
                                                              auVar12[0xb] = -(cStack_2d ==
                                                                              uStack_10._3_1_);
                                                              auVar12[0xc] = -(cStack_2c ==
                                                                              uStack_10._4_1_);
                                                              auVar12[0xd] = -(cStack_2b ==
                                                                              uStack_10._5_1_);
                                                              auVar12[0xe] = -(cStack_2a ==
                                                                              uStack_10._6_1_);
                                                              auVar12[0xf] = -(cStack_29 ==
                                                                              uStack_10._7_1_);
                                                              auVar8 = auVar8 & auVar12;
                                                              if ((ushort)((ushort)(SUB161(auVar8 >>
                                                                                           7,0) & 1)
                                                                           | (ushort)(SUB161(auVar8 
                                                  >> 0xf,0) & 1) << 1 |
                                                  (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                                                  (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                                                  (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff
                                                  ) {
                                                    (*pSVar2->close)(pSVar2);
                                                    puts("test4 OK");
                                                    pSVar2 = (SDL_RWops *)
                                                             SDL_RWFromFile("sdldata1","ab+");
                                                    if (pSVar2 == (SDL_RWops *)0x0) {
                                                      uVar4 = 0x9d;
                                                      goto LAB_00101cdb;
                                                    }
                                                    iVar1 = (*pSVar2->write)(pSVar2,"1234567890",10,
                                                                             1);
                                                    if (iVar1 == 1) {
                                                      iVar1 = (*pSVar2->write)(pSVar2,"1234567890",1
                                                                               ,10);
                                                      if (iVar1 == 10) {
                                                        iVar1 = (*pSVar2->write)(pSVar2,"1234567",1,
                                                                                 7);
                                                        if (iVar1 == 7) {
                                                          iVar1 = (*pSVar2->seek)(pSVar2,0,0);
                                                          if (iVar1 == 0) {
                                                            iVar1 = (*pSVar2->read)(pSVar2,&local_38
                                                                                    ,1,1);
                                                            if (iVar1 == 1) {
                                                              iVar1 = (*pSVar2->seek)(pSVar2,0,0);
                                                              if (iVar1 == 0) {
                                                                iVar1 = (*pSVar2->seek)(pSVar2,-7,2)
                                                                ;
                                                                if (iVar1 == 0x2f) {
                                                                  iVar1 = (*pSVar2->read)(pSVar2,&
                                                  local_38,1,7);
                                                  if (iVar1 == 7) {
                                                    if (CONCAT13(cStack_32,
                                                                 CONCAT12(cStack_33,
                                                                          CONCAT11(cStack_34,
                                                                                   cStack_35))) ==
                                                        0x37363534 &&
                                                        CONCAT13(cStack_35,
                                                                 CONCAT12(cStack_36,
                                                                          CONCAT11(cStack_37,
                                                                                   local_38))) ==
                                                        0x34333231) {
                                                      iVar1 = (*pSVar2->read)(pSVar2,&local_38,1,1);
                                                      if (iVar1 == 0) {
                                                        iVar1 = (*pSVar2->read)(pSVar2,&local_38,10,
                                                                                100);
                                                        if (iVar1 == 0) {
                                                          iVar1 = (*pSVar2->seek)(pSVar2,-0x1b,1);
                                                          if (iVar1 == 0x1b) {
                                                            iVar1 = (*pSVar2->seek)(pSVar2,0,0);
                                                            if (iVar1 == 0) {
                                                              iVar1 = (*pSVar2->read)(pSVar2,&
                                                  local_38,10,3);
                                                  if (iVar1 == 3) {
                                                    auVar13[0] = -((char)local_18 == local_38);
                                                    auVar13[1] = -(local_18._1_1_ == cStack_37);
                                                    auVar13[2] = -(local_18._2_1_ == cStack_36);
                                                    auVar13[3] = -(local_18._3_1_ == cStack_35);
                                                    auVar13[4] = -(local_18._4_1_ == cStack_34);
                                                    auVar13[5] = -(local_18._5_1_ == cStack_33);
                                                    auVar13[6] = -(local_18._6_1_ == cStack_32);
                                                    auVar13[7] = -(local_18._7_1_ == cStack_31);
                                                    auVar13[8] = -((char)uStack_10 == cStack_30);
                                                    auVar13[9] = -(uStack_10._1_1_ == cStack_2f);
                                                    auVar13[10] = -(uStack_10._2_1_ == cStack_2e);
                                                    auVar13[0xb] = -(uStack_10._3_1_ == cStack_2d);
                                                    auVar13[0xc] = -(uStack_10._4_1_ == cStack_2c);
                                                    auVar13[0xd] = -(uStack_10._5_1_ == cStack_2b);
                                                    auVar13[0xe] = -(uStack_10._6_1_ == cStack_2a);
                                                    auVar13[0xf] = -(uStack_10._7_1_ == cStack_29);
                                                    auVar9[0] = -(cStack_2a == '5');
                                                    auVar9[1] = -(cStack_29 == '6');
                                                    auVar9[2] = -(local_28 == '7');
                                                    auVar9[3] = -(cStack_27 == '8');
                                                    auVar9[4] = -(cStack_26 == '9');
                                                    auVar9[5] = -(cStack_25 == '0');
                                                    auVar9[6] = -(cStack_24 == '1');
                                                    auVar9[7] = -(cStack_23 == '2');
                                                    auVar9[8] = -(cStack_22 == '3');
                                                    auVar9[9] = -(cStack_21 == '4');
                                                    auVar9[10] = -(cStack_20 == '5');
                                                    auVar9[0xb] = -(cStack_1f == '6');
                                                    auVar9[0xc] = -(cStack_1e == '7');
                                                    auVar9[0xd] = -(cStack_1d == '1');
                                                    auVar9[0xe] = -(cStack_1c == '2');
                                                    auVar9[0xf] = -(cStack_1b == '3');
                                                    auVar9 = auVar9 & auVar13;
                                                    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1)
                                                                 | (ushort)(SUB161(auVar9 >> 0xf,0)
                                                                           & 1) << 1 |
                                                                 (ushort)(SUB161(auVar9 >> 0x17,0) &
                                                                         1) << 2 |
                                                                 (ushort)(SUB161(auVar9 >> 0x1f,0) &
                                                                         1) << 3 |
                                                                 (ushort)(SUB161(auVar9 >> 0x27,0) &
                                                                         1) << 4 |
                                                                 (ushort)(SUB161(auVar9 >> 0x2f,0) &
                                                                         1) << 5 |
                                                                 (ushort)(SUB161(auVar9 >> 0x37,0) &
                                                                         1) << 6 |
                                                                 (ushort)(SUB161(auVar9 >> 0x3f,0) &
                                                                         1) << 7 |
                                                                 (ushort)(SUB161(auVar9 >> 0x47,0) &
                                                                         1) << 8 |
                                                                 (ushort)(SUB161(auVar9 >> 0x4f,0) &
                                                                         1) << 9 |
                                                                 (ushort)(SUB161(auVar9 >> 0x57,0) &
                                                                         1) << 10 |
                                                                 (ushort)(SUB161(auVar9 >> 0x5f,0) &
                                                                         1) << 0xb |
                                                                 (ushort)(SUB161(auVar9 >> 0x67,0) &
                                                                         1) << 0xc |
                                                                 (ushort)(SUB161(auVar9 >> 0x6f,0) &
                                                                         1) << 0xd |
                                                                 (ushort)(SUB161(auVar9 >> 0x77,0) &
                                                                         1) << 0xe |
                                                                (ushort)(byte)(auVar9[0xf] >> 7) <<
                                                                0xf) == 0xffff) {
                                                      (*pSVar2->close)(pSVar2);
                                                      puts("test5 OK");
                                                      unlink("sdldata1");
                                                      unlink("sdldata2");
                                                      return 0;
                                                    }
                                                    uVar5 = 0xb1;
                                                  }
                                                  else {
                                                    uVar5 = 0xaf;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0xae;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0xac;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0xaa;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0xa9;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0xa8;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0xa7;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0xa6;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0xa4;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0xa3;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0xa1;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0xa0;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x9f;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x9e;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x97;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x96;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x95;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x94;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x93;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x92;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x91;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x90;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x8f;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x8e;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x8d;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x8c;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x8b;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x8a;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x83;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x82;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x81;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x80;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x7f;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x7e;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x7d;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x7c;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x7b;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x7a;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = 0x79;
                                                  }
                                                }
                                                else {
                                                  uVar5 = 0x78;
                                                }
                                              }
                                              else {
                                                uVar5 = 0x77;
                                              }
                                            }
                                            else {
                                              uVar5 = 0x76;
                                            }
                                          }
                                          else {
                                            uVar5 = 0x70;
                                          }
                                        }
                                        else {
                                          uVar5 = 0x6f;
                                        }
                                      }
                                      else {
                                        uVar5 = 0x6e;
                                      }
                                    }
                                    else {
                                      uVar5 = 0x6d;
                                    }
                                  }
                                  else {
                                    uVar5 = 0x6c;
                                  }
                                }
                                else {
                                  uVar5 = 0x6b;
                                }
                              }
                              else {
                                uVar5 = 0x6a;
                              }
                            }
                            else {
                              uVar5 = 0x69;
                            }
                          }
                          else {
                            uVar5 = 0x68;
                          }
                        }
                        else {
                          uVar5 = 0x67;
                        }
                      }
                      else {
                        uVar5 = 0x62;
                      }
                    }
                    else {
                      uVar5 = 0x61;
                    }
                  }
                  else {
                    uVar5 = 0x60;
                  }
                }
                else {
                  uVar5 = 0x5f;
                }
              }
              else {
                uVar5 = 0x5e;
              }
              rwops_error_quit(uVar5,pSVar2);
              unlink("sdldata1");
              iVar1 = unlink("sdldata2");
              return iVar1;
            }
            uVar4 = 0x5d;
          }
        }
      }
      goto LAB_00101cdb;
    }
  }
  else {
    uVar5 = 0x37;
LAB_00101a91:
    rwops_error_quit(uVar5,pSVar2);
  }
  uVar4 = 0x4c;
LAB_00101cdb:
  ctx = "testfile.c(%d): failed\n";
  printf("testfile.c(%d): failed\n",uVar4);
  cleanup((EVP_PKEY_CTX *)ctx);
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_RWops *rwops = NULL;
	char test_buf[30];
	
	cleanup();

/* test 1 : basic argument test: all those calls to SDL_RWFromFile should fail */
	
	rwops = SDL_RWFromFile(NULL,NULL);
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile(NULL,"ab+");
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile(NULL,"sldfkjsldkfj");
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile("something","");
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile("something",NULL);
	if (rwops) RWOP_ERR_QUIT(rwops);	
	printf("test1 OK\n");

/* test 2 : check that inexistant file is not successfully opened/created when required */
/* modes : r, r+ implie that file MUST exist 
   modes : a, a+, w, w+ checks that it succeeds (file may not exists)
   
 */
	rwops = SDL_RWFromFile(FBASENAME2,"rb"); /* this file doesn't exist that call must fail */
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile(FBASENAME2,"rb+"); /* this file doesn't exist that call must fail */
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile(FBASENAME2,"wb");
	if (!rwops) RWOP_ERR_QUIT(rwops); 
	rwops->close(rwops); unlink(FBASENAME2);
	rwops = SDL_RWFromFile(FBASENAME2,"wb+");
	if (!rwops) RWOP_ERR_QUIT(rwops); 
	rwops->close(rwops); unlink(FBASENAME2);
	rwops = SDL_RWFromFile(FBASENAME2,"ab"); 
	if (!rwops) RWOP_ERR_QUIT(rwops); 
	rwops->close(rwops); unlink(FBASENAME2);
	rwops = SDL_RWFromFile(FBASENAME2,"ab+");
	if (!rwops) RWOP_ERR_QUIT(rwops); 
	rwops->close(rwops); unlink(FBASENAME2);
	printf("test2 OK\n");

/* test 3 : creation, writing , reading, seeking, 
	        test : w mode, r mode, w+ mode
 */
	rwops = SDL_RWFromFile(FBASENAME1,"wb"); /* write only */	
	if (!rwops)											RWOP_ERR_QUIT(rwops);
	if (1 != rwops->write(rwops,"1234567890",10,1) )	RWOP_ERR_QUIT(rwops);		
	if (10 != rwops->write(rwops,"1234567890",1,10) )	RWOP_ERR_QUIT(rwops);		
	if (7 != rwops->write(rwops,"1234567",1,7) )		RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (0!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops); /* we are in write only mode */
	rwops->close(rwops);

	rwops = SDL_RWFromFile(FBASENAME1,"rb"); /* read mode, file must exists */
	if (!rwops)											RWOP_ERR_QUIT(rwops);
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (20!=rwops->seek(rwops,-7,RW_SEEK_END))			RWOP_ERR_QUIT(rwops);					
	if (7!=rwops->read(rwops,test_buf,1,7))				RWOP_ERR_QUIT(rwops);		
	if (SDL_memcmp(test_buf,"1234567",7))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,10,100))			RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,-27,RW_SEEK_CUR))			RWOP_ERR_QUIT(rwops);		
	if (2!=rwops->read(rwops,test_buf,10,3))			RWOP_ERR_QUIT(rwops);				
	if (SDL_memcmp(test_buf,"12345678901234567890",20))	RWOP_ERR_QUIT(rwops);
	if (0!=rwops->write(rwops,test_buf,1,1))			RWOP_ERR_QUIT(rwops); /* readonly mode */
	rwops->close(rwops);

/* test 3: same with w+ mode */
	rwops = SDL_RWFromFile(FBASENAME1,"wb+"); /* write + read + truncation */		
	if (!rwops)											RWOP_ERR_QUIT(rwops);
	if (1 != rwops->write(rwops,"1234567890",10,1) )	RWOP_ERR_QUIT(rwops);		
	if (10 != rwops->write(rwops,"1234567890",1,10) )	RWOP_ERR_QUIT(rwops);		
	if (7 != rwops->write(rwops,"1234567",1,7) )		RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (1!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops); /* we are in read/write mode */
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (20!=rwops->seek(rwops,-7,RW_SEEK_END))			RWOP_ERR_QUIT(rwops);					
	if (7!=rwops->read(rwops,test_buf,1,7))				RWOP_ERR_QUIT(rwops);		
	if (SDL_memcmp(test_buf,"1234567",7))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,10,100))			RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,-27,RW_SEEK_CUR))			RWOP_ERR_QUIT(rwops);		
	if (2!=rwops->read(rwops,test_buf,10,3))			RWOP_ERR_QUIT(rwops);				
	if (SDL_memcmp(test_buf,"12345678901234567890",20))	RWOP_ERR_QUIT(rwops);
	rwops->close(rwops);
	printf("test3 OK\n");

/* test 4: same in r+ mode */
	rwops = SDL_RWFromFile(FBASENAME1,"rb+"); /* write + read + file must exists, no truncation */		
	if (!rwops)											RWOP_ERR_QUIT(rwops);
	if (1 != rwops->write(rwops,"1234567890",10,1) )	RWOP_ERR_QUIT(rwops);		
	if (10 != rwops->write(rwops,"1234567890",1,10) )	RWOP_ERR_QUIT(rwops);		
	if (7 != rwops->write(rwops,"1234567",1,7) )		RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (1!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops); /* we are in read/write mode */
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (20!=rwops->seek(rwops,-7,RW_SEEK_END))			RWOP_ERR_QUIT(rwops);					
	if (7!=rwops->read(rwops,test_buf,1,7))				RWOP_ERR_QUIT(rwops);		
	if (SDL_memcmp(test_buf,"1234567",7))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,10,100))			RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,-27,RW_SEEK_CUR))			RWOP_ERR_QUIT(rwops);		
	if (2!=rwops->read(rwops,test_buf,10,3))			RWOP_ERR_QUIT(rwops);				
	if (SDL_memcmp(test_buf,"12345678901234567890",20))	RWOP_ERR_QUIT(rwops);
	rwops->close(rwops);
	printf("test4 OK\n");

/* test5 : append mode */
	rwops = SDL_RWFromFile(FBASENAME1,"ab+"); /* write + read + append */		
	if (!rwops)											RWOP_ERR_QUIT(rwops);
	if (1 != rwops->write(rwops,"1234567890",10,1) )	RWOP_ERR_QUIT(rwops);		
	if (10 != rwops->write(rwops,"1234567890",1,10) )	RWOP_ERR_QUIT(rwops);		
	if (7 != rwops->write(rwops,"1234567",1,7) )		RWOP_ERR_QUIT(rwops); 	
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	
	if (1!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops); 
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	
	if (20+27!=rwops->seek(rwops,-7,RW_SEEK_END))		RWOP_ERR_QUIT(rwops);					
	if (7!=rwops->read(rwops,test_buf,1,7))				RWOP_ERR_QUIT(rwops);		
	if (SDL_memcmp(test_buf,"1234567",7))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,10,100))			RWOP_ERR_QUIT(rwops);		
	
	if (27!=rwops->seek(rwops,-27,RW_SEEK_CUR))			RWOP_ERR_QUIT(rwops);
	
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);
	if (3!=rwops->read(rwops,test_buf,10,3))			RWOP_ERR_QUIT(rwops);				
	if (SDL_memcmp(test_buf,"123456789012345678901234567123",30))	
														RWOP_ERR_QUIT(rwops);
	rwops->close(rwops);
	printf("test5 OK\n");
	cleanup();
	return 0; /* all ok */
}